

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

ssize_t __thiscall
QTextStreamPrivate::read(QTextStreamPrivate *this,int __fd,void *__buf,size_t __nbytes)

{
  QString *this_00;
  QArrayData *data;
  _func_int **pp_Var1;
  QObjectData *pQVar2;
  bool bVar3;
  void *pvVar4;
  undefined4 in_register_00000034;
  QTextStreamPrivate *this_01;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  this_01 = (QTextStreamPrivate *)CONCAT44(in_register_00000034,__fd);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->device = (QIODevice *)0x0;
  (this->deviceClosedNotifier).super_QObject._vptr_QObject = (_func_int **)0x0;
  (this->deviceClosedNotifier).super_QObject.d_ptr.d = (QObjectData *)0x0;
  this_00 = this_01->string;
  if (this_00 == (QString *)0x0) {
    do {
      if ((long)__buf <= (this_01->readBuffer).d.size - this_01->readBufferOffset) break;
      bVar3 = fillReadBuffer(this_01,-1);
    } while (bVar3);
    pvVar4 = (void *)((this_01->readBuffer).d.size - this_01->readBufferOffset);
    if ((long)__buf <= (long)pvVar4) {
      pvVar4 = __buf;
    }
    this_01->lastTokenSize = (qsizetype)pvVar4;
    QString::mid(&local_38,&this_01->readBuffer,this_01->readBufferOffset,(qsizetype)pvVar4);
  }
  else {
    pvVar4 = (void *)((this_00->d).size - this_01->stringOffset);
    if ((long)__buf <= (long)pvVar4) {
      pvVar4 = __buf;
    }
    this_01->lastTokenSize = (qsizetype)pvVar4;
    QString::mid(&local_38,this_00,this_01->stringOffset,(qsizetype)pvVar4);
  }
  data = (QArrayData *)this->device;
  pp_Var1 = (this->deviceClosedNotifier).super_QObject._vptr_QObject;
  this->device = (QIODevice *)local_38.d.d;
  (this->deviceClosedNotifier).super_QObject._vptr_QObject = (_func_int **)local_38.d.ptr;
  pQVar2 = (this->deviceClosedNotifier).super_QObject.d_ptr.d;
  (this->deviceClosedNotifier).super_QObject.d_ptr.d = (QObjectData *)local_38.d.size;
  local_38.d.d = (Data *)data;
  local_38.d.ptr = (char16_t *)pp_Var1;
  local_38.d.size = (qsizetype)pQVar2;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  consumeLastToken(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (ssize_t)this;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextStreamPrivate::read(qsizetype maxlen)
{
    QString ret;
    if (string) {
        lastTokenSize = qMin(maxlen, string->size() - stringOffset);
        ret = string->mid(stringOffset, lastTokenSize);
    } else {
        while (readBuffer.size() - readBufferOffset < maxlen && fillReadBuffer()) {}
        lastTokenSize = qMin(maxlen, readBuffer.size() - readBufferOffset);
        ret = readBuffer.mid(readBufferOffset, lastTokenSize);
    }
    consumeLastToken();

#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStreamPrivate::read() maxlen = %d, token length = %d",
           int(maxlen), int(ret.length()));
#endif
    return ret;
}